

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseRAPass::assignRAInst
          (BaseRAPass *this,BaseNode *node,RABlock *block,RAInstBuilder *ib)

{
  undefined8 *puVar1;
  uint *puVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  Zone *this_00;
  undefined8 uVar6;
  undefined8 uVar7;
  Error EVar8;
  undefined8 *puVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  RAInstBuilder *pRVar15;
  RARegIndex index;
  
  uVar13 = *(long *)(ib + 0x38) - (long)(ib + 0x40);
  uVar3 = *(undefined8 *)(ib + 4);
  this_00 = *(Zone **)&this->_allocator;
  uVar14 = (uVar13 & 0x1fffffffe0) + 0x50;
  puVar9 = *(undefined8 **)this_00;
  if ((ulong)(*(long *)(this_00 + 8) - (long)puVar9) < uVar14) {
    puVar9 = (undefined8 *)Zone::_alloc(this_00,uVar14,1);
  }
  else {
    *(ulong *)this_00 = uVar14 + (long)puVar9;
  }
  iVar12 = (int)(uVar13 >> 5);
  if (puVar9 == (undefined8 *)0x0) {
    puVar9 = (undefined8 *)0x0;
  }
  else {
    *(undefined8 *)((long)puVar9 + 0x1c) = 0;
    *(undefined8 *)((long)puVar9 + 0x24) = 0;
    *puVar9 = block;
    puVar9[1] = uVar3;
    *(int *)(puVar9 + 2) = iVar12;
    *(undefined8 *)((long)puVar9 + 0x34) = 0;
    *(undefined8 *)((long)puVar9 + 0x14) = 0;
    *(undefined8 *)((long)puVar9 + 0x1c) = 0;
    *(undefined8 *)((long)puVar9 + 0x24) = 0;
    *(undefined8 *)((long)puVar9 + 0x2c) = 0;
    uVar3 = *(undefined8 *)(ib + 0x30);
    *(undefined8 *)((long)puVar9 + 0x3c) = *(undefined8 *)(ib + 0x28);
    *(undefined8 *)((long)puVar9 + 0x44) = uVar3;
  }
  if (puVar9 == (undefined8 *)0x0) {
    EVar8 = 1;
  }
  else {
    uVar10 = (uint)(byte)ib[0x11] + (uint)(byte)ib[0x10];
    if (0xff < uVar10) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/../core/../core/radefs_p.h"
                 ,0xda,"y <= 0xFF");
    }
    if (0xff < (byte)ib[0x12] + uVar10) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/../core/../core/radefs_p.h"
                 ,0xdb,"z <= 0xFF");
    }
    uVar5 = *(uint *)(ib + 0xc);
    index.super_RARegCount.field_0 =
         (RARegCount)
         (((byte)ib[0x12] + uVar10) * 0x1000000 | uVar10 * 0x10000 | (uint)(byte)ib[0x10] << 8);
    ((anon_union_4_2_ebeb14a8_for_RARegCount_0 *)((long)puVar9 + 0x14))->_packed =
         (uint32_t)index.super_RARegCount.field_0;
    *(undefined4 *)(puVar9 + 3) = *(undefined4 *)(ib + 0x10);
    if (iVar12 != 0) {
      pRVar15 = ib + 0x4f;
      uVar13 = 0;
      do {
        if (((ulong)(*(long *)(ib + 0x38) - (long)(ib + 0x40)) >> 5 & 0xffffffff) <= uVar13) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/rapass_p.h"
                     ,0x1d8,"index < tiedRegCount()");
        }
        if (*(uint *)&this->field_0x148 <= *(uint *)(pRVar15 + -0xf)) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/../core/zonevector.h"
                     ,0x175,"i < _size");
        }
        lVar11 = *(long *)(*(long *)&this->_workRegs + (ulong)*(uint *)(pRVar15 + -0xf) * 8);
        *(undefined8 *)(lVar11 + 0x10) = 0;
        uVar10 = *(byte *)(lVar11 + 0x21) & 0xf;
        uVar14 = (ulong)uVar10;
        if (pRVar15[-1] != (RAInstBuilder)0xff) {
          block[0xd] = (RABlock)((byte)block[0xd] | 8);
          if (3 < (byte)uVar10) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../core/../core/../core/../core/support.h"
                       ,0x68d,"U(index) < N");
          }
          puVar2 = (uint *)((long)puVar9 + (ulong)uVar10 * 4 + 0x2c);
          *puVar2 = *puVar2 | 1 << ((byte)pRVar15[-1] & 0x1f);
        }
        if (*pRVar15 != (RAInstBuilder)0xff) {
          block[0xd] = (RABlock)((byte)block[0xd] | 8);
        }
        if (3 < (byte)uVar10) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/arm/../arm/../core/../core/../core/../core/radefs_p.h"
                     ,0xa4,"group <= RegGroup::kMaxVirt");
        }
        bVar4 = index.super_RARegCount.field_0._regs[uVar14];
        index.super_RARegCount.field_0._regs[uVar14] = bVar4 + 1;
        lVar11 = (ulong)bVar4 * 0x20;
        uVar3 = *(undefined8 *)(pRVar15 + -7);
        uVar6 = *(undefined8 *)(pRVar15 + 1);
        uVar7 = *(undefined8 *)(pRVar15 + 9);
        puVar1 = (undefined8 *)((long)puVar9 + lVar11 + 0x4c);
        *puVar1 = *(undefined8 *)(pRVar15 + -0xf);
        puVar1[1] = uVar3;
        puVar1 = (undefined8 *)((long)puVar9 + lVar11 + 0x5c);
        *puVar1 = uVar6;
        puVar1[1] = uVar7;
        puVar2 = (uint *)((long)puVar9 + lVar11 + 0x54);
        *puVar2 = *puVar2 & ~uVar5;
        if (((byte)pRVar15[-5] & 1) == 0) {
          puVar2 = (uint *)((long)puVar9 + lVar11 + 0x5c);
          *puVar2 = *puVar2 & ~*(uint *)(ib + uVar14 * 4 + 0x18);
        }
        uVar13 = uVar13 + 1;
        pRVar15 = pRVar15 + 0x20;
      } while (iVar12 != (int)uVar13);
    }
    *(undefined8 **)(node + 0x20) = puVar9;
    EVar8 = 0;
  }
  return EVar8;
}

Assistant:

ASMJIT_FORCE_INLINE Error assignRAInst(BaseNode* node, RABlock* block, RAInstBuilder& ib) noexcept {
    uint32_t tiedRegCount = ib.tiedRegCount();
    RAInst* raInst = newRAInst(block, ib.instRWFlags(), ib.aggregatedFlags(), tiedRegCount, ib._clobbered);

    if (ASMJIT_UNLIKELY(!raInst))
      return DebugUtils::errored(kErrorOutOfMemory);

    RARegIndex index;
    RATiedFlags flagsFilter = ~ib.forbiddenFlags();

    index.buildIndexes(ib._count);
    raInst->_tiedIndex = index;
    raInst->_tiedCount = ib._count;

    for (uint32_t i = 0; i < tiedRegCount; i++) {
      RATiedReg* tiedReg = ib[i];
      RAWorkReg* workReg = workRegById(tiedReg->workId());

      workReg->resetTiedReg();
      RegGroup group = workReg->group();

      if (tiedReg->hasUseId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
        raInst->_usedRegs[group] |= Support::bitMask(tiedReg->useId());
      }

      if (tiedReg->hasOutId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
      }

      RATiedReg& dst = raInst->_tiedRegs[index[group]++];
      dst = *tiedReg;
      dst._flags &= flagsFilter;

      if (!tiedReg->isDuplicate())
        dst._useRegMask &= ~ib._used[group];
    }

    node->setPassData<RAInst>(raInst);
    return kErrorOk;
  }